

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::JSObjectFieldName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          FieldDescriptor *field)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  bool in_R8B;
  bool in_R9B;
  string in_stack_ffffffffffffffc8;
  undefined7 uStack_37;
  undefined1 local_28 [16];
  
  JSIdent_abi_cxx11_(__return_storage_ptr__,this,(GeneratorOptions *)0x0,(FieldDescriptor *)0x0,
                     in_R8B,in_R9B,(bool)in_stack_ffffffffffffffc8);
  iVar2 = std::__cxx11::string::compare((char *)__return_storage_ptr__);
  if (iVar2 != 0) {
    uVar1 = 0;
    do {
      uVar3 = uVar1;
      if (uVar3 == 0x39) break;
      iVar2 = std::__cxx11::string::compare((char *)__return_storage_ptr__);
      uVar1 = uVar3 + 1;
    } while (iVar2 != 0);
    if (0x38 < uVar3) {
      return __return_storage_ptr__;
    }
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffffc8,"pb_",__return_storage_ptr__);
  std::__cxx11::string::operator=
            ((string *)__return_storage_ptr__,(string *)&stack0xffffffffffffffc8);
  if ((undefined1 *)CONCAT71(uStack_37,in_stack_ffffffffffffffc8) != local_28) {
    operator_delete((undefined1 *)CONCAT71(uStack_37,in_stack_ffffffffffffffc8));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string JSObjectFieldName(const GeneratorOptions& options,
                              const FieldDescriptor* field) {
  std::string name = JSIdent(options, field,
                             /* is_upper_camel = */ false,
                             /* is_map = */ false,
                             /* drop_list = */ false);
  if (IsReserved(name)) {
    name = "pb_" + name;
  }
  return name;
}